

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O2

cab * __thiscall cab_manager::create(cab_manager *this,weak_ptr<cab_session> *cab_session)

{
  node_type nVar1;
  __shared_ptr<cab,(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar2;
  vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *this_01;
  __shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2> *__r;
  id_type id;
  undefined1 local_34 [4];
  weak_ptr<cab_session> local_30;
  road_network *local_20;
  
  local_34 = (undefined1  [4])this->_counter;
  this->_counter = (int)local_34 + 1;
  local_20 = &this->_rnet;
  std::make_unique<cab,std::weak_ptr<cab_session>&,cab_manager&,unsigned_int&,road_network*>
            ((weak_ptr<cab_session> *)(local_34 + 4),(cab_manager *)cab_session,(uint *)this,
             (road_network **)local_34);
  this_00 = (__shared_ptr<cab,(__gnu_cxx::_Lock_policy)2> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,(key_type *)local_34);
  std::__shared_ptr<cab,(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,(unique_ptr<cab,_std::default_delete<cab>_> *)(local_34 + 4));
  std::unique_ptr<cab,_std::default_delete<cab>_>::~unique_ptr
            ((unique_ptr<cab,_std::default_delete<cab>_> *)(local_34 + 4));
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,(key_type *)local_34);
  nVar1 = cab::position((pmVar2->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_20 = (road_network *)CONCAT71(local_20._1_7_,nVar1);
  this_01 = (vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *)
            std::
            map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::operator[](&this->_cabs_at_node,(key_type *)&local_20);
  __r = &std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)this,(key_type *)local_34)->
         super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>;
  std::__weak_ptr<cab,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<cab,void>
            ((__weak_ptr<cab,(__gnu_cxx::_Lock_policy)2> *)(local_34 + 4),__r);
  std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>::
  emplace_back<std::weak_ptr<cab>>(this_01,(weak_ptr<cab> *)(local_34 + 4));
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_30.super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,(key_type *)local_34);
  return (pmVar2->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

cab& cab_manager::create(std::weak_ptr<cab_session> cab_session)
{
    auto id = _counter++;
    _cabs[id] = std::make_unique<cab>(cab_session, *this, id, &_rnet);
    
    _cabs_at_node[_cabs[id]->position()].push_back(_cabs[id]);

    return *_cabs[id];
}